

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_writer::write_jpegls_preset_parameters_segment
          (jpeg_stream_writer *this,jpegls_pc_parameters *preset_coding_parameters)

{
  underlying_type_t<charls::jpegls_preset_parameters_type> value;
  jpegls_pc_parameters *preset_coding_parameters_local;
  jpeg_stream_writer *this_local;
  
  write_segment_header(this,jpegls_preset_parameters,0xb);
  value = to_underlying_type<charls::jpegls_preset_parameters_type>(preset_coding_parameters);
  write_uint8(this,value);
  write_uint16(this,preset_coding_parameters->maximum_sample_value);
  write_uint16(this,preset_coding_parameters->threshold1);
  write_uint16(this,preset_coding_parameters->threshold2);
  write_uint16(this,preset_coding_parameters->threshold3);
  write_uint16(this,preset_coding_parameters->reset_value);
  return;
}

Assistant:

void jpeg_stream_writer::write_jpegls_preset_parameters_segment(const jpegls_pc_parameters& preset_coding_parameters)
{
    write_segment_header(jpeg_marker_code::jpegls_preset_parameters, 1 + 5 * sizeof(uint16_t));
    write_uint8(to_underlying_type(jpegls_preset_parameters_type::preset_coding_parameters));
    write_uint16(preset_coding_parameters.maximum_sample_value);
    write_uint16(preset_coding_parameters.threshold1);
    write_uint16(preset_coding_parameters.threshold2);
    write_uint16(preset_coding_parameters.threshold3);
    write_uint16(preset_coding_parameters.reset_value);
}